

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void lock_now(quicly_conn_t *conn,int is_reentrant)

{
  long lVar1;
  int in_ESI;
  long *in_RDI;
  
  if (in_RDI[0x138] == 0) {
    if ((char)in_RDI[0x139] != '\0') {
      __assert_fail("conn->stash.lock_count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e1,"void lock_now(quicly_conn_t *, int)");
    }
    lVar1 = (*(code *)**(undefined8 **)(*in_RDI + 0xd0))(*(undefined8 *)(*in_RDI + 0xd0));
    in_RDI[0x138] = lVar1;
  }
  else {
    if (in_ESI == 0) {
      __assert_fail("is_reentrant && \"caller must be reentrant\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e4,"void lock_now(quicly_conn_t *, int)");
    }
    if ((char)in_RDI[0x139] == '\0') {
      __assert_fail("conn->stash.lock_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x1e5,"void lock_now(quicly_conn_t *, int)");
    }
  }
  *(char *)(in_RDI + 0x139) = (char)in_RDI[0x139] + '\x01';
  return;
}

Assistant:

static void lock_now(quicly_conn_t *conn, int is_reentrant)
{
    if (conn->stash.now == 0) {
        assert(conn->stash.lock_count == 0);
        conn->stash.now = conn->super.ctx->now->cb(conn->super.ctx->now);
    } else {
        assert(is_reentrant && "caller must be reentrant");
        assert(conn->stash.lock_count != 0);
    }

    ++conn->stash.lock_count;
}